

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O1

int mbedtls_pem_read_buffer
              (mbedtls_pem_context *ctx,char *header,char *footer,uchar *data,uchar *pwd,
              size_t pwdlen,size_t *use_len)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  size_t sVar7;
  ulong uVar8;
  uint keylen;
  size_t sVar9;
  uchar *puVar10;
  long *plVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  size_t len;
  uchar pem_iv [16];
  size_t local_68;
  uchar *local_60;
  uchar local_58 [24];
  size_t local_40;
  uchar *local_38;
  
  if (ctx == (mbedtls_pem_context *)0x0) {
    return -0x1480;
  }
  local_40 = pwdlen;
  local_38 = pwd;
  puVar6 = (uchar *)strstr((char *)data,header);
  if (puVar6 == (uchar *)0x0) {
    return -0x1080;
  }
  local_60 = (uchar *)strstr((char *)data,footer);
  if (local_60 <= puVar6) {
    return -0x1080;
  }
  sVar7 = strlen(header);
  lVar2 = (puVar6[sVar7] == ' ') + sVar7;
  if (puVar6[(ulong)(puVar6[(puVar6[sVar7] == ' ') + sVar7] == '\r') + lVar2] != '\n') {
    return -0x1080;
  }
  lVar2 = (ulong)(puVar6[(puVar6[sVar7] == ' ') + sVar7] == '\r') + lVar2;
  puVar10 = puVar6 + lVar2 + 1;
  sVar7 = strlen(footer);
  lVar3 = (local_60[sVar7] == ' ') + sVar7;
  *use_len = (size_t)(local_60 +
                     (((ulong)(local_60[(ulong)(local_60[(local_60[sVar7] == ' ') + sVar7] == '\r')
                                        + lVar3] == '\n') +
                      (ulong)(local_60[(local_60[sVar7] == ' ') + sVar7] == '\r') + lVar3) -
                     (long)data));
  bVar1 = true;
  iVar5 = 0;
  if ((0x15 < (long)local_60 - (long)puVar10) &&
     (auVar18[0] = -(puVar6[lVar2 + 7] == 'y'), auVar18[1] = -(puVar6[lVar2 + 8] == 'p'),
     auVar18[2] = -(puVar6[lVar2 + 9] == 'e'), auVar18[3] = -(puVar6[lVar2 + 10] == ':'),
     auVar18[4] = -(puVar6[lVar2 + 0xb] == ' '), auVar18[5] = -(puVar6[lVar2 + 0xc] == '4'),
     auVar18[6] = -(puVar6[lVar2 + 0xd] == ','), auVar18[7] = -(puVar6[lVar2 + 0xe] == 'E'),
     auVar18[8] = -(puVar6[lVar2 + 0xf] == 'N'), auVar18[9] = -(puVar6[lVar2 + 0x10] == 'C'),
     auVar18[10] = -(puVar6[lVar2 + 0x11] == 'R'), auVar18[0xb] = -(puVar6[lVar2 + 0x12] == 'Y'),
     auVar18[0xc] = -(puVar6[lVar2 + 0x13] == 'P'), auVar18[0xd] = -(puVar6[lVar2 + 0x14] == 'T'),
     auVar18[0xe] = -(puVar6[lVar2 + 0x15] == 'E'), auVar18[0xf] = -(puVar6[lVar2 + 0x16] == 'D'),
     auVar12[0] = -(*puVar10 == 'P'), auVar12[1] = -(puVar6[lVar2 + 2] == 'r'),
     auVar12[2] = -(puVar6[lVar2 + 3] == 'o'), auVar12[3] = -(puVar6[lVar2 + 4] == 'c'),
     auVar12[4] = -(puVar6[lVar2 + 5] == '-'), auVar12[5] = -(puVar6[lVar2 + 6] == 'T'),
     auVar12[6] = -(puVar6[lVar2 + 7] == 'y'), auVar12[7] = -(puVar6[lVar2 + 8] == 'p'),
     auVar12[8] = -(puVar6[lVar2 + 9] == 'e'), auVar12[9] = -(puVar6[lVar2 + 10] == ':'),
     auVar12[10] = -(puVar6[lVar2 + 0xb] == ' '), auVar12[0xb] = -(puVar6[lVar2 + 0xc] == '4'),
     auVar12[0xc] = -(puVar6[lVar2 + 0xd] == ','), auVar12[0xd] = -(puVar6[lVar2 + 0xe] == 'E'),
     auVar12[0xe] = -(puVar6[lVar2 + 0xf] == 'N'), auVar12[0xf] = -(puVar6[lVar2 + 0x10] == 'C'),
     auVar12 = auVar12 & auVar18, iVar5 = 0,
     (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff)) {
    lVar3 = lVar2 + 0x17;
    if (puVar6[lVar2 + 0x17] == '\r') {
      lVar3 = lVar2 + 0x18;
    }
    puVar10 = puVar6 + lVar3;
    if (puVar6[(ulong)(puVar6[lVar2 + 0x17] == '\r') + 0x17 + lVar2] != '\n') {
      return -0x1100;
    }
    plVar11 = (long *)(puVar10 + 1);
    if (((long)local_60 - (long)plVar11 < 0x17) ||
       (auVar19[0] = -(puVar10[8] == 'o'), auVar19[1] = -(puVar10[9] == ':'),
       auVar19[2] = -(puVar10[10] == ' '), auVar19[3] = -(puVar10[0xb] == 'D'),
       auVar19[4] = -(puVar10[0xc] == 'E'), auVar19[5] = -(puVar10[0xd] == 'S'),
       auVar19[6] = -(puVar10[0xe] == '-'), auVar19[7] = -(puVar10[0xf] == 'E'),
       auVar19[8] = -(puVar10[0x10] == 'D'), auVar19[9] = -(puVar10[0x11] == 'E'),
       auVar19[10] = -(puVar10[0x12] == '3'), auVar19[0xb] = -(puVar10[0x13] == '-'),
       auVar19[0xc] = -(puVar10[0x14] == 'C'), auVar19[0xd] = -(puVar10[0x15] == 'B'),
       auVar19[0xe] = -(puVar10[0x16] == 'C'), auVar19[0xf] = -(puVar10[0x17] == ','),
       auVar13[0] = -((char)*plVar11 == 'D'), auVar13[1] = -(puVar10[2] == 'E'),
       auVar13[2] = -(puVar10[3] == 'K'), auVar13[3] = -(puVar10[4] == '-'),
       auVar13[4] = -(puVar10[5] == 'I'), auVar13[5] = -(puVar10[6] == 'n'),
       auVar13[6] = -(puVar10[7] == 'f'), auVar13[7] = -(puVar10[8] == 'o'),
       auVar13[8] = -(puVar10[9] == ':'), auVar13[9] = -(puVar10[10] == ' '),
       auVar13[10] = -(puVar10[0xb] == 'D'), auVar13[0xb] = -(puVar10[0xc] == 'E'),
       auVar13[0xc] = -(puVar10[0xd] == 'S'), auVar13[0xd] = -(puVar10[0xe] == '-'),
       auVar13[0xe] = -(puVar10[0xf] == 'E'), auVar13[0xf] = -(puVar10[0x10] == 'D'),
       auVar13 = auVar13 & auVar19,
       (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff)) {
      iVar5 = 0;
      if ((0x11 < (long)local_60 - (long)plVar11) &&
         (auVar14[0] = -((char)*plVar11 == 'D'), auVar14[1] = -(puVar10[2] == 'E'),
         auVar14[2] = -(puVar10[3] == 'K'), auVar14[3] = -(puVar10[4] == '-'),
         auVar14[4] = -(puVar10[5] == 'I'), auVar14[5] = -(puVar10[6] == 'n'),
         auVar14[6] = -(puVar10[7] == 'f'), auVar14[7] = -(puVar10[8] == 'o'),
         auVar14[8] = -(puVar10[9] == ':'), auVar14[9] = -(puVar10[10] == ' '),
         auVar14[10] = -(puVar10[0xb] == 'D'), auVar14[0xb] = -(puVar10[0xc] == 'E'),
         auVar14[0xc] = -(puVar10[0xd] == 'S'), auVar14[0xd] = -(puVar10[0xe] == '-'),
         auVar14[0xe] = -(puVar10[0xf] == 'C'), auVar14[0xf] = -(puVar10[0x10] == 'B'),
         auVar20[0] = -((char)*(undefined2 *)(puVar10 + 0x11) == 'C'),
         auVar20[1] = -((char)((ushort)*(undefined2 *)(puVar10 + 0x11) >> 8) == ','),
         auVar20[2] = 0xff, auVar20[3] = 0xff, auVar20[4] = 0xff, auVar20[5] = 0xff,
         auVar20[6] = 0xff, auVar20[7] = 0xff, auVar20[8] = 0xff, auVar20[9] = 0xff,
         auVar20[10] = 0xff, auVar20[0xb] = 0xff, auVar20[0xc] = 0xff, auVar20[0xd] = 0xff,
         auVar20[0xe] = 0xff, auVar20[0xf] = 0xff, auVar20 = auVar20 & auVar14, iVar5 = 0,
         (ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff)) {
        if ((long)local_60 - (long)(puVar10 + 0x13) < 0x10) {
          return -0x1200;
        }
        iVar5 = pem_get_iv(puVar10 + 0x13,local_58,8);
        if (iVar5 != 0) {
          return -0x1200;
        }
        plVar11 = (long *)(puVar10 + 0x23);
        iVar5 = 0x21;
      }
    }
    else {
      if ((long)local_60 - (long)(puVar10 + 0x18) < 0x10) {
        return -0x1200;
      }
      iVar5 = pem_get_iv(puVar10 + 0x18,local_58,8);
      if (iVar5 != 0) {
        return -0x1200;
      }
      plVar11 = (long *)(puVar10 + 0x28);
      iVar5 = 0x25;
    }
    if ((0xd < (long)local_60 - (long)plVar11) &&
       (*(long *)((long)plVar11 + 6) == 0x2d534541203a6f66 && *plVar11 == 0x6f666e492d4b4544)) {
      if ((long)local_60 - (long)plVar11 < 0x16) {
        return -0x1280;
      }
      auVar21[0] = -(*(char *)((long)plVar11 + 6) == 'f');
      auVar21[1] = -(*(char *)((long)plVar11 + 7) == 'o');
      auVar21[2] = -((char)plVar11[1] == ':');
      auVar21[3] = -(*(char *)((long)plVar11 + 9) == ' ');
      auVar21[4] = -(*(char *)((long)plVar11 + 10) == 'A');
      auVar21[5] = -(*(char *)((long)plVar11 + 0xb) == 'E');
      auVar21[6] = -(*(char *)((long)plVar11 + 0xc) == 'S');
      auVar21[7] = -(*(char *)((long)plVar11 + 0xd) == '-');
      auVar21[8] = -(*(char *)((long)plVar11 + 0xe) == '1');
      auVar21[9] = -(*(char *)((long)plVar11 + 0xf) == '2');
      auVar21[10] = -((char)plVar11[2] == '8');
      auVar21[0xb] = -(*(char *)((long)plVar11 + 0x11) == '-');
      auVar21[0xc] = -(*(char *)((long)plVar11 + 0x12) == 'C');
      auVar21[0xd] = -(*(char *)((long)plVar11 + 0x13) == 'B');
      auVar21[0xe] = -(*(char *)((long)plVar11 + 0x14) == 'C');
      auVar21[0xf] = -(*(char *)((long)plVar11 + 0x15) == ',');
      auVar15[0] = -((char)*plVar11 == 'D');
      auVar15[1] = -(*(char *)((long)plVar11 + 1) == 'E');
      auVar15[2] = -(*(char *)((long)plVar11 + 2) == 'K');
      auVar15[3] = -(*(char *)((long)plVar11 + 3) == '-');
      auVar15[4] = -(*(char *)((long)plVar11 + 4) == 'I');
      auVar15[5] = -(*(char *)((long)plVar11 + 5) == 'n');
      auVar15[6] = -(*(char *)((long)plVar11 + 6) == 'f');
      auVar15[7] = -(*(char *)((long)plVar11 + 7) == 'o');
      auVar15[8] = -((char)plVar11[1] == ':');
      auVar15[9] = -(*(char *)((long)plVar11 + 9) == ' ');
      auVar15[10] = -(*(char *)((long)plVar11 + 10) == 'A');
      auVar15[0xb] = -(*(char *)((long)plVar11 + 0xb) == 'E');
      auVar15[0xc] = -(*(char *)((long)plVar11 + 0xc) == 'S');
      auVar15[0xd] = -(*(char *)((long)plVar11 + 0xd) == '-');
      auVar15[0xe] = -(*(char *)((long)plVar11 + 0xe) == '1');
      auVar15[0xf] = -(*(char *)((long)plVar11 + 0xf) == '2');
      auVar15 = auVar15 & auVar21;
      if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff) {
        iVar5 = 5;
      }
      else {
        auVar22[0] = -(*(char *)((long)plVar11 + 6) == 'f');
        auVar22[1] = -(*(char *)((long)plVar11 + 7) == 'o');
        auVar22[2] = -((char)plVar11[1] == ':');
        auVar22[3] = -(*(char *)((long)plVar11 + 9) == ' ');
        auVar22[4] = -(*(char *)((long)plVar11 + 10) == 'A');
        auVar22[5] = -(*(char *)((long)plVar11 + 0xb) == 'E');
        auVar22[6] = -(*(char *)((long)plVar11 + 0xc) == 'S');
        auVar22[7] = -(*(char *)((long)plVar11 + 0xd) == '-');
        auVar22[8] = -(*(char *)((long)plVar11 + 0xe) == '1');
        auVar22[9] = -(*(char *)((long)plVar11 + 0xf) == '9');
        auVar22[10] = -((char)plVar11[2] == '2');
        auVar22[0xb] = -(*(char *)((long)plVar11 + 0x11) == '-');
        auVar22[0xc] = -(*(char *)((long)plVar11 + 0x12) == 'C');
        auVar22[0xd] = -(*(char *)((long)plVar11 + 0x13) == 'B');
        auVar22[0xe] = -(*(char *)((long)plVar11 + 0x14) == 'C');
        auVar22[0xf] = -(*(char *)((long)plVar11 + 0x15) == ',');
        auVar16[0] = -((char)*plVar11 == 'D');
        auVar16[1] = -(*(char *)((long)plVar11 + 1) == 'E');
        auVar16[2] = -(*(char *)((long)plVar11 + 2) == 'K');
        auVar16[3] = -(*(char *)((long)plVar11 + 3) == '-');
        auVar16[4] = -(*(char *)((long)plVar11 + 4) == 'I');
        auVar16[5] = -(*(char *)((long)plVar11 + 5) == 'n');
        auVar16[6] = -(*(char *)((long)plVar11 + 6) == 'f');
        auVar16[7] = -(*(char *)((long)plVar11 + 7) == 'o');
        auVar16[8] = -((char)plVar11[1] == ':');
        auVar16[9] = -(*(char *)((long)plVar11 + 9) == ' ');
        auVar16[10] = -(*(char *)((long)plVar11 + 10) == 'A');
        auVar16[0xb] = -(*(char *)((long)plVar11 + 0xb) == 'E');
        auVar16[0xc] = -(*(char *)((long)plVar11 + 0xc) == 'S');
        auVar16[0xd] = -(*(char *)((long)plVar11 + 0xd) == '-');
        auVar16[0xe] = -(*(char *)((long)plVar11 + 0xe) == '1');
        auVar16[0xf] = -(*(char *)((long)plVar11 + 0xf) == '9');
        auVar16 = auVar16 & auVar22;
        if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff) {
          iVar5 = 6;
        }
        else {
          auVar23[0] = -(*(char *)((long)plVar11 + 6) == 'f');
          auVar23[1] = -(*(char *)((long)plVar11 + 7) == 'o');
          auVar23[2] = -((char)plVar11[1] == ':');
          auVar23[3] = -(*(char *)((long)plVar11 + 9) == ' ');
          auVar23[4] = -(*(char *)((long)plVar11 + 10) == 'A');
          auVar23[5] = -(*(char *)((long)plVar11 + 0xb) == 'E');
          auVar23[6] = -(*(char *)((long)plVar11 + 0xc) == 'S');
          auVar23[7] = -(*(char *)((long)plVar11 + 0xd) == '-');
          auVar23[8] = -(*(char *)((long)plVar11 + 0xe) == '2');
          auVar23[9] = -(*(char *)((long)plVar11 + 0xf) == '5');
          auVar23[10] = -((char)plVar11[2] == '6');
          auVar23[0xb] = -(*(char *)((long)plVar11 + 0x11) == '-');
          auVar23[0xc] = -(*(char *)((long)plVar11 + 0x12) == 'C');
          auVar23[0xd] = -(*(char *)((long)plVar11 + 0x13) == 'B');
          auVar23[0xe] = -(*(char *)((long)plVar11 + 0x14) == 'C');
          auVar23[0xf] = -(*(char *)((long)plVar11 + 0x15) == ',');
          auVar17[0] = -((char)*plVar11 == 'D');
          auVar17[1] = -(*(char *)((long)plVar11 + 1) == 'E');
          auVar17[2] = -(*(char *)((long)plVar11 + 2) == 'K');
          auVar17[3] = -(*(char *)((long)plVar11 + 3) == '-');
          auVar17[4] = -(*(char *)((long)plVar11 + 4) == 'I');
          auVar17[5] = -(*(char *)((long)plVar11 + 5) == 'n');
          auVar17[6] = -(*(char *)((long)plVar11 + 6) == 'f');
          auVar17[7] = -(*(char *)((long)plVar11 + 7) == 'o');
          auVar17[8] = -((char)plVar11[1] == ':');
          auVar17[9] = -(*(char *)((long)plVar11 + 9) == ' ');
          auVar17[10] = -(*(char *)((long)plVar11 + 10) == 'A');
          auVar17[0xb] = -(*(char *)((long)plVar11 + 0xb) == 'E');
          auVar17[0xc] = -(*(char *)((long)plVar11 + 0xc) == 'S');
          auVar17[0xd] = -(*(char *)((long)plVar11 + 0xd) == '-');
          auVar17[0xe] = -(*(char *)((long)plVar11 + 0xe) == '2');
          auVar17[0xf] = -(*(char *)((long)plVar11 + 0xf) == '5');
          auVar17 = auVar17 & auVar23;
          if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff) {
            return -0x1280;
          }
          iVar5 = 7;
        }
      }
      if ((long)local_60 - ((long)plVar11 + 0x16) < 0x20) {
        return -0x1200;
      }
      iVar4 = pem_get_iv((uchar *)((long)plVar11 + 0x16),local_58,0x10);
      if (iVar4 != 0) {
        return -0x1200;
      }
      plVar11 = (long *)((long)plVar11 + 0x36);
    }
    if (iVar5 == 0) {
      return -0x1280;
    }
    uVar8 = (ulong)((char)*plVar11 == '\r');
    if (*(char *)((long)plVar11 + uVar8) != '\n') {
      return -0x1100;
    }
    puVar10 = (uchar *)((long)plVar11 + uVar8 + 1);
    bVar1 = false;
  }
  if (local_60 <= puVar10) {
    return -0x1100;
  }
  sVar9 = (long)local_60 - (long)puVar10;
  iVar4 = mbedtls_base64_decode((uchar *)0x0,0,&local_68,puVar10,sVar9);
  sVar7 = local_68;
  if (iVar4 == -0x2c) {
    return -0x112c;
  }
  puVar6 = (uchar *)calloc(1,local_68);
  if (puVar6 == (uchar *)0x0) {
    return -0x1180;
  }
  local_60 = (uchar *)CONCAT44(local_60._4_4_,iVar5);
  iVar5 = mbedtls_base64_decode(puVar6,sVar7,&local_68,puVar10,sVar9);
  puVar10 = local_38;
  sVar9 = local_40;
  if (iVar5 != 0) {
    mbedtls_platform_zeroize(puVar6,local_68);
    free(puVar6);
    return iVar5 + -0x1100;
  }
  if (bVar1) goto LAB_0012bd84;
  if (local_38 == (uchar *)0x0) {
    mbedtls_platform_zeroize(puVar6,local_68);
    free(puVar6);
    return -0x1300;
  }
  iVar5 = (int)local_60;
  if ((int)local_60 == 0x21) {
    iVar4 = pem_des_decrypt(local_58,puVar6,local_68,local_38,local_40);
  }
  else {
    iVar4 = 0;
    if ((int)local_60 == 0x25) {
      iVar4 = pem_des3_decrypt(local_58,puVar6,local_68,local_38,local_40);
    }
  }
  if (iVar5 == 7) {
    keylen = 0x20;
LAB_0012bfbd:
    iVar4 = pem_aes_decrypt(local_58,keylen,puVar6,local_68,puVar10,sVar9);
  }
  else {
    if (iVar5 == 6) {
      keylen = 0x18;
      goto LAB_0012bfbd;
    }
    if (iVar5 == 5) {
      keylen = 0x10;
      goto LAB_0012bfbd;
    }
  }
  if (iVar4 != 0) {
    free(puVar6);
    return iVar4;
  }
  if (((local_68 < 3) || (*puVar6 != '0')) || (0x83 < puVar6[1])) {
    mbedtls_platform_zeroize(puVar6,local_68);
    free(puVar6);
    return -0x1380;
  }
LAB_0012bd84:
  ctx->buf = puVar6;
  ctx->buflen = local_68;
  return 0;
}

Assistant:

int mbedtls_pem_read_buffer( mbedtls_pem_context *ctx, const char *header, const char *footer,
                     const unsigned char *data, const unsigned char *pwd,
                     size_t pwdlen, size_t *use_len )
{
    int ret, enc;
    size_t len;
    unsigned char *buf;
    const unsigned char *s1, *s2, *end;
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
    unsigned char pem_iv[16];
    mbedtls_cipher_type_t enc_alg = MBEDTLS_CIPHER_NONE;
#else
    ((void) pwd);
    ((void) pwdlen);
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */

    if( ctx == NULL )
        return( MBEDTLS_ERR_PEM_BAD_INPUT_DATA );

    s1 = (unsigned char *) strstr( (const char *) data, header );

    if( s1 == NULL )
        return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    s2 = (unsigned char *) strstr( (const char *) data, footer );

    if( s2 == NULL || s2 <= s1 )
        return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    s1 += strlen( header );
    if( *s1 == ' '  ) s1++;
    if( *s1 == '\r' ) s1++;
    if( *s1 == '\n' ) s1++;
    else return( MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT );

    end = s2;
    end += strlen( footer );
    if( *end == ' '  ) end++;
    if( *end == '\r' ) end++;
    if( *end == '\n' ) end++;
    *use_len = end - data;

    enc = 0;

    if( s2 - s1 >= 22 && memcmp( s1, "Proc-Type: 4,ENCRYPTED", 22 ) == 0 )
    {
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
        enc++;

        s1 += 22;
        if( *s1 == '\r' ) s1++;
        if( *s1 == '\n' ) s1++;
        else return( MBEDTLS_ERR_PEM_INVALID_DATA );


#if defined(MBEDTLS_DES_C)
        if( s2 - s1 >= 23 && memcmp( s1, "DEK-Info: DES-EDE3-CBC,", 23 ) == 0 )
        {
            enc_alg = MBEDTLS_CIPHER_DES_EDE3_CBC;

            s1 += 23;
            if( s2 - s1 < 16 || pem_get_iv( s1, pem_iv, 8 ) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 16;
        }
        else if( s2 - s1 >= 18 && memcmp( s1, "DEK-Info: DES-CBC,", 18 ) == 0 )
        {
            enc_alg = MBEDTLS_CIPHER_DES_CBC;

            s1 += 18;
            if( s2 - s1 < 16 || pem_get_iv( s1, pem_iv, 8) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 16;
        }
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if( s2 - s1 >= 14 && memcmp( s1, "DEK-Info: AES-", 14 ) == 0 )
        {
            if( s2 - s1 < 22 )
                return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );
            else if( memcmp( s1, "DEK-Info: AES-128-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_128_CBC;
            else if( memcmp( s1, "DEK-Info: AES-192-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_192_CBC;
            else if( memcmp( s1, "DEK-Info: AES-256-CBC,", 22 ) == 0 )
                enc_alg = MBEDTLS_CIPHER_AES_256_CBC;
            else
                return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );

            s1 += 22;
            if( s2 - s1 < 32 || pem_get_iv( s1, pem_iv, 16 ) != 0 )
                return( MBEDTLS_ERR_PEM_INVALID_ENC_IV );

            s1 += 32;
        }
#endif /* MBEDTLS_AES_C */

        if( enc_alg == MBEDTLS_CIPHER_NONE )
            return( MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG );

        if( *s1 == '\r' ) s1++;
        if( *s1 == '\n' ) s1++;
        else return( MBEDTLS_ERR_PEM_INVALID_DATA );
#else
        return( MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE );
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */
    }

    if( s1 >= s2 )
        return( MBEDTLS_ERR_PEM_INVALID_DATA );

    ret = mbedtls_base64_decode( NULL, 0, &len, s1, s2 - s1 );

    if( ret == MBEDTLS_ERR_BASE64_INVALID_CHARACTER )
        return( MBEDTLS_ERR_PEM_INVALID_DATA + ret );

    if( ( buf = mbedtls_calloc( 1, len ) ) == NULL )
        return( MBEDTLS_ERR_PEM_ALLOC_FAILED );

    if( ( ret = mbedtls_base64_decode( buf, len, &len, s1, s2 - s1 ) ) != 0 )
    {
        mbedtls_platform_zeroize( buf, len );
        mbedtls_free( buf );
        return( MBEDTLS_ERR_PEM_INVALID_DATA + ret );
    }

    if( enc != 0 )
    {
#if defined(MBEDTLS_MD5_C) && defined(MBEDTLS_CIPHER_MODE_CBC) &&         \
    ( defined(MBEDTLS_DES_C) || defined(MBEDTLS_AES_C) )
        if( pwd == NULL )
        {
            mbedtls_platform_zeroize( buf, len );
            mbedtls_free( buf );
            return( MBEDTLS_ERR_PEM_PASSWORD_REQUIRED );
        }

        ret = 0;

#if defined(MBEDTLS_DES_C)
        if( enc_alg == MBEDTLS_CIPHER_DES_EDE3_CBC )
            ret = pem_des3_decrypt( pem_iv, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_DES_CBC )
            ret = pem_des_decrypt( pem_iv, buf, len, pwd, pwdlen );
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if( enc_alg == MBEDTLS_CIPHER_AES_128_CBC )
            ret = pem_aes_decrypt( pem_iv, 16, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_AES_192_CBC )
            ret = pem_aes_decrypt( pem_iv, 24, buf, len, pwd, pwdlen );
        else if( enc_alg == MBEDTLS_CIPHER_AES_256_CBC )
            ret = pem_aes_decrypt( pem_iv, 32, buf, len, pwd, pwdlen );
#endif /* MBEDTLS_AES_C */

        if( ret != 0 )
        {
            mbedtls_free( buf );
            return( ret );
        }

        /*
         * The result will be ASN.1 starting with a SEQUENCE tag, with 1 to 3
         * length bytes (allow 4 to be sure) in all known use cases.
         *
         * Use that as a heuristic to try to detect password mismatches.
         */
        if( len <= 2 || buf[0] != 0x30 || buf[1] > 0x83 )
        {
            mbedtls_platform_zeroize( buf, len );
            mbedtls_free( buf );
            return( MBEDTLS_ERR_PEM_PASSWORD_MISMATCH );
        }
#else
        mbedtls_platform_zeroize( buf, len );
        mbedtls_free( buf );
        return( MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE );
#endif /* MBEDTLS_MD5_C && MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_DES_C ) */
    }

    ctx->buf = buf;
    ctx->buflen = len;

    return( 0 );
}